

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O3

ptr<resp_msg> __thiscall cornerstone::raft_server::handle_cli_req(raft_server *this,req_msg *req)

{
  ulong uVar1;
  undefined4 uVar2;
  element_type *peVar3;
  _func_int **pp_Var4;
  long *plVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  undefined8 *puVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  long lVar10;
  runtime_error *this_01;
  undefined8 uVar11;
  long in_RDX;
  undefined **ppuVar12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  ulong uVar13;
  long lVar14;
  undefined1 auVar15 [16];
  ptr<resp_msg> pVar16;
  
  bVar8 = is_leader((raft_server *)req);
  peVar3 = ((req[3].log_entries_.
             super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
           super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((bVar8) ||
     (*(int *)&req[3].log_entries_.
               super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
               ._M_impl.super__Vector_impl_data._M_start != 3)) {
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x40);
    this_00->_M_use_count = 1;
    this_00->_M_weak_count = 1;
    this_00->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00178730;
    *(element_type **)&this_00[1]._M_use_count = peVar3;
    *(undefined4 *)&this_00[2]._vptr__Sp_counted_base = 4;
    uVar1 = (req->super_msg_base).term_;
    *(ulong *)((long)&this_00[2]._vptr__Sp_counted_base + 4) =
         CONCAT44((int)uVar1,(int)(uVar1 >> 0x20));
    this_00[1]._vptr__Sp_counted_base = (_func_int **)&PTR__msg_base_00178780;
    this_00[3]._vptr__Sp_counted_base = (_func_int **)0x0;
    *(undefined1 *)&this_00[3]._M_use_count = 0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->leader_ = this_00;
    this->_vptr_raft_server = (_func_int **)(this_00 + 1);
    ppuVar12 = (undefined **)extraout_RDX;
    if (bVar8) {
      lVar10 = *(long *)(in_RDX + 0x38);
      if (*(long *)(in_RDX + 0x40) != lVar10) {
        lVar14 = 0;
        uVar13 = 0;
        do {
          **(undefined8 **)(lVar10 + lVar14) =
               ((req[3].log_entries_.
                 super__Vector_base<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)->
               super___shared_ptr<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          pp_Var4 = req[4].super_msg_base._vptr_msg_base;
          (**(code **)(*pp_Var4 + 0x28))(pp_Var4,lVar10 + lVar14);
          plVar5 = *(long **)&req[4].super_msg_base.type_;
          lVar10 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
          if ((ulong)(*(long *)(in_RDX + 0x40) - *(long *)(in_RDX + 0x38) >> 4) <= uVar13) {
            uVar11 = std::__throw_out_of_range_fmt
                               ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                                ,uVar13);
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            _Unwind_Resume(uVar11);
          }
          lVar6 = *(long *)(*(long *)(in_RDX + 0x38) + lVar14);
          lVar7 = *(long *)(lVar6 + 0x18);
          if (lVar7 == 0) {
            this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error
                      (this_01,"get_buf cannot be called for a log_entry with nil buffer");
            __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          (**(code **)(*plVar5 + 0x18))(plVar5,lVar10 + -1,lVar7,lVar6 + 0x20);
          uVar13 = uVar13 + 1;
          lVar10 = *(long *)(in_RDX + 0x38);
          lVar14 = lVar14 + 0x10;
        } while (uVar13 < (ulong)(*(long *)(in_RDX + 0x40) - lVar10 >> 4));
      }
      request_append_entries((raft_server *)req);
      auVar15 = (**(code **)(*req[4].super_msg_base._vptr_msg_base + 0x10))();
      ppuVar12 = auVar15._8_8_;
      this_00[3]._vptr__Sp_counted_base = auVar15._0_8_;
      *(undefined1 *)&this_00[3]._M_use_count = 1;
    }
  }
  else {
    puVar9 = (undefined8 *)operator_new(0x40);
    puVar9[1] = 0x100000001;
    *puVar9 = &PTR___Sp_counted_ptr_inplace_00178730;
    uVar2 = *(undefined4 *)((long)&(req->super_msg_base).term_ + 4);
    puVar9[3] = peVar3;
    *(undefined4 *)(puVar9 + 4) = 4;
    *(undefined4 *)((long)puVar9 + 0x24) = uVar2;
    *(undefined4 *)(puVar9 + 5) = 0xffffffff;
    ppuVar12 = &PTR__msg_base_00178780;
    puVar9[2] = &PTR__msg_base_00178780;
    puVar9[6] = 0;
    *(undefined1 *)(puVar9 + 7) = 0;
    *(undefined8 **)&this->leader_ = puVar9;
    this->_vptr_raft_server = (_func_int **)(puVar9 + 2);
  }
  pVar16.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar12;
  pVar16.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar16.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_cli_req(req_msg& req)
{
    bool leader = is_leader();

    // check if leader has expired.
    // there could be a case that the leader just elected, in that case, client can
    // just simply retry, no safety issue here.
    if (role_ == srv_role::leader && !leader)
    {
        return cs_new<resp_msg>(state_->get_term(), msg_type::append_entries_response, id_, -1);
    }

    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::append_entries_response, id_, leader_));
    if (!leader)
    {
        return resp;
    }

    std::vector<ptr<log_entry>>& entries = req.log_entries();
    for (size_t i = 0; i < entries.size(); ++i)
    {
        // force the log's term to current term
        entries.at(i)->set_term(state_->get_term());

        log_store_->append(entries.at(i));
        state_machine_->pre_commit(log_store_->next_slot() - 1, entries.at(i)->get_buf(), entries.at(i)->get_cookie());
    }

    // urgent commit, so that the commit will not depend on hb
    request_append_entries();
    resp->accept(log_store_->next_slot());
    return resp;
}